

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O3

lws_context * lws_create_context(lws_context_creation_info *info)

{
  lws *__s;
  undefined4 uVar1;
  undefined4 uVar2;
  lws_plugin_evlib_t *plVar3;
  lws_retry_bo_t *plVar4;
  uint16_t uVar5;
  ushort uVar6;
  int iVar7;
  uint uVar8;
  lws_context *context;
  ulong uVar9;
  lws_usec_t lVar10;
  lws_role_ops *plVar11;
  lws_smd_peer *plVar12;
  lws_context *plVar13;
  pollfd *ppVar14;
  size_t sVar15;
  lws_event_loop_ops *plVar16;
  lws_vhost *plVar17;
  lws_cache_ttl_lru *plVar18;
  uint16_t uVar19;
  uint uVar20;
  long lVar21;
  char *pcVar22;
  lws_plugin_evlib_t *plVar23;
  lws_context_tls *plVar24;
  void *pvVar25;
  lws_log_cx_t *cx;
  lws_context_tls *str;
  lws **pplVar26;
  ulong uVar27;
  lws_role_ops **pplVar28;
  bool bVar29;
  bool bVar30;
  uint local_9c;
  rlimit rl;
  
  local_9c = info->fd_limit_per_thread + 2;
  if (info->fd_limit_per_thread == 0) {
    local_9c = 0;
  }
  iVar7 = lws_plat_context_early_init();
  if (iVar7 != 0) {
    return (lws_context *)0x0;
  }
  bVar29 = info->count_threads == 0;
  bVar30 = (short)info->count_threads != 0;
  uVar27 = 0x1000;
  if (info->pt_serv_buf_size != 0) {
    uVar27 = (ulong)info->pt_serv_buf_size;
  }
  plVar3 = info->event_lib_custom;
  plVar23 = plVar3;
  if (plVar3 == (lws_plugin_evlib_t *)0x0) {
    plVar23 = &evlib_poll;
  }
  lVar21 = 2000;
  if (bVar30 || bVar29) {
    lVar21 = uVar27 + 0xc68;
  }
  uVar9 = (ulong)plVar23->ops->evlib_size_pt;
  if (!bVar30 && !bVar29) {
    uVar9 = 0;
  }
  context = (lws_context *)
            lws_zalloc((ulong)plVar23->ops->evlib_size_ctx + lVar21 + uVar9,"context");
  if (context == (lws_context *)0x0) {
    _lws_log(1,"OOM");
    return (lws_context *)0x0;
  }
  uVar9 = 1000;
  if (plVar3 != (lws_plugin_evlib_t *)0x0) {
    uVar9 = 0;
  }
  context->event_loop_ops = plVar23->ops;
  context->us_wait_resolution = (uint16_t)uVar9;
  uVar1 = info->gid;
  uVar2 = info->uid;
  context->uid = uVar2;
  context->gid = uVar1;
  pcVar22 = info->groupname;
  context->username = info->username;
  context->groupname = pcVar22;
  context->name = info->vhost_name;
  cx = info->log_cx;
  if (cx == (lws_log_cx_t *)0x0) {
    cx = &log_cx;
  }
  context->log_cx = cx;
  lwsl_refcount_cx(cx,1);
  context->system_ops = info->system_ops;
  context->pt_serv_buf_size = (uint)uVar27;
  context->protocols_copy = info->protocols;
  lVar21 = 2000000;
  if (info->smd_ttl_us != 0) {
    lVar21 = info->smd_ttl_us;
  }
  context->smd_ttl_us = lVar21;
  uVar5 = (uint16_t)*(undefined4 *)&info->smd_queue_depth;
  uVar19 = 0x28;
  if (uVar5 != 0) {
    uVar19 = uVar5;
  }
  context->smd_queue_depth = uVar19;
  context->lcg[0].tag_prefix = "wsi";
  context->lcg[1].tag_prefix = "vh";
  context->lcg[2].tag_prefix = "wsisrv";
  context->lcg[3].tag_prefix = "mux";
  context->lcg[4].tag_prefix = "wsicli";
  _lws_log_cx(context->log_cx,lws_log_prepend_context,context,4,"lws_create_context","LWS: %s, %s%s"
              ,"4.2.99-v4.2.0-121-gb47cf25d","NET CLI SRV H1 H2 WS ConMon ","IPv6-absent");
  _lws_log_cx(context->log_cx,lws_log_prepend_context,context,8,"lws_create_context",
              "Event loop: %s",plVar23->ops->name);
  context->undestroyed_threads = (ushort)(bVar30 || bVar29);
  context->count_threads = (ushort)(bVar30 || bVar29);
  if (info->extensions != (lws_extension *)0x0) {
    _lws_log_cx(context->log_cx,lws_log_prepend_context,context,2,"lws_create_context",
                "WITHOUT_EXTENSIONS but exts ptr set");
  }
  iVar7 = lws_plat_drop_app_privileges(context,0);
  if (iVar7 != 0) goto LAB_0010a69d;
  context->tls_ops = &tls_ops_openssl;
  (context->fops_platform).open = _lws_plat_file_open;
  (context->fops_platform).close = _lws_plat_file_close;
  (context->fops_platform).seek_cur = _lws_plat_file_seek_cur;
  (context->fops_platform).read = _lws_plat_file_read;
  (context->fops_platform).write = _lws_plat_file_write;
  (context->fops_platform).fi[0].sig = (char *)0x0;
  context->fops = &context->fops_platform;
  if (info->fops != (lws_plat_file_ops *)0x0) {
    (context->fops_platform).next = info->fops;
  }
  context->reject_service_keywords = info->reject_service_keywords;
  if (info->external_baggage_free_on_destroy != (void *)0x0) {
    context->external_baggage_free_on_destroy = info->external_baggage_free_on_destroy;
  }
  lVar10 = lws_now_usecs();
  context->time_up = lVar10;
  context->pcontext_finalize = info->pcontext;
  context->simultaneous_ssl_restriction = info->simultaneous_ssl_restriction;
  context->ssl_handshake_serialize = info->ssl_handshake_serialize;
  context->options = info->options;
  uVar27 = (ulong)(uint)info->rlimit_nofile;
  if (uVar27 != 0) {
    rl.rlim_cur = uVar27;
    rl.rlim_max = uVar27;
    setrlimit(RLIMIT_NOFILE,(rlimit *)&rl);
  }
  uVar27 = sysconf(4);
  context->max_fds = 0xa00;
  if ((long)uVar27 < 0x989681) {
    if (uVar27 != 0xffffffffffffffff) {
      context->max_fds = (uint)uVar27;
      goto LAB_0010a838;
    }
    uVar8 = 0xa00;
  }
  else {
    _lws_log_cx(context->log_cx,lws_log_prepend_context,context,2,"lws_create_context",
                "unreasonable ulimit -n workaround");
    uVar27 = (ulong)context->max_fds;
LAB_0010a838:
    uVar8 = (uint)uVar27;
    if ((int)uVar8 < 0) {
      _lws_log_cx(context->log_cx,lws_log_prepend_context,context,1,"lws_create_context",
                  "problem getting process max files");
      goto LAB_0010a69d;
    }
  }
  if ((info->fd_limit_per_thread != 0) &&
     (uVar20 = context->count_threads * local_9c, uVar20 < uVar8)) {
    context->field_0x7b8 = context->field_0x7b8 | 4;
    context->max_fds = uVar20;
  }
  context->token_limits = info->token_limits;
  time(&(context->tls).last_cert_check_s);
  plVar24 = (lws_context_tls *)info->alpn;
  if ((plVar24 == (lws_context_tls *)0x0) &&
     (plVar24 = &context->tls, available_roles[0] != (lws_role_ops *)0x0)) {
    pplVar28 = available_roles;
    bVar29 = true;
    plVar11 = available_roles[0];
    str = plVar24;
    do {
      pplVar28 = pplVar28 + 1;
      pcVar22 = plVar11->alpn;
      if (pcVar22 != (char *)0x0) {
        if (!bVar29) {
          str->alpn_discovered[0] = ',';
          str = (lws_context_tls *)(str->alpn_discovered + 1);
          pcVar22 = plVar11->alpn;
        }
        bVar29 = false;
        iVar7 = lws_snprintf(str->alpn_discovered,(ulong)(uint)(((int)context + 0x606) - (int)str),
                             "%s",pcVar22);
        str = (lws_context_tls *)(str->alpn_discovered + iVar7);
      }
      plVar11 = *pplVar28;
    } while (plVar11 != (lws_role_ops *)0x0);
  }
  (context->tls).alpn_default = plVar24->alpn_discovered;
  uVar8 = 0xf;
  if (info->timeout_secs != 0) {
    uVar8 = info->timeout_secs;
  }
  context->timeout_secs = uVar8;
  uVar8 = (uint)info->max_http_header_data;
  if (info->max_http_header_data == 0) {
    uVar8 = 0x1000;
    if (info->max_http_header_data2 != 0) {
      uVar8 = info->max_http_header_data2 & 0xffff;
    }
  }
  context->max_http_header_data = uVar8;
  uVar8 = (uint)info->max_http_header_pool;
  if (info->max_http_header_pool == 0) {
    if (info->max_http_header_pool2 == 0) {
      uVar8 = context->max_fds;
    }
    else {
      uVar8 = info->max_http_header_pool2 & 0xffff;
    }
  }
  context->max_http_header_pool = uVar8;
  if (info->fd_limit_per_thread == 0) {
    if (context->count_threads != 0) {
      local_9c = context->max_fds / (uint)context->count_threads;
      goto LAB_0010a9b7;
    }
  }
  else {
LAB_0010a9b7:
    context->fd_limit_per_thread = local_9c;
  }
  pthread_mutex_init((pthread_mutex_t *)&(context->smd).lock_messages,(pthread_mutexattr_t *)0x0);
  pthread_mutex_init((pthread_mutex_t *)&(context->smd).lock_peers,(pthread_mutexattr_t *)0x0);
  plVar12 = lws_smd_register(context,context,0,4,lws_system_smd_cb);
  if (plVar12 == (lws_smd_peer *)0x0) {
    _lws_log_cx(context->log_cx,lws_log_prepend_context,context,1,"lws_create_context",
                "early smd register failed");
  }
  if ((info->early_smd_cb != (lws_smd_notification_cb_t)0x0) &&
     (plVar12 = lws_smd_register(context,info->early_smd_opaque,0,info->early_smd_class_filter,
                                 info->early_smd_cb), plVar12 == (lws_smd_peer *)0x0)) {
    _lws_log_cx(context->log_cx,lws_log_prepend_context,context,1,"lws_create_context",
                "early smd register failed");
  }
  (context->default_retry).retry_ms_table = default_backoff_table;
  (context->default_retry).retry_ms_table_count = 4;
  (context->default_retry).conceal_count = 4;
  (context->default_retry).secs_since_valid_ping = 300;
  (context->default_retry).secs_since_valid_hangup = 0x136;
  (context->default_retry).jitter_percent = '\x14';
  plVar4 = info->retry_and_idle_policy;
  if ((plVar4 != (lws_retry_bo_t *)0x0) && (plVar4->secs_since_valid_ping != 0)) {
    (context->default_retry).secs_since_valid_ping = plVar4->secs_since_valid_ping;
    (context->default_retry).secs_since_valid_hangup = plVar4->secs_since_valid_hangup;
  }
  if (context->count_threads == 0) {
    iVar7 = 0;
  }
  else {
    plVar13 = context + 1;
    pplVar26 = &context->pt[0].fake_wsi;
    uVar27 = 0;
    do {
      pplVar26[5] = (lws *)plVar13;
      uVar8 = context->pt_serv_buf_size;
      __s = (lws *)(plVar13->canonical_hostname + uVar8);
      pplVar26[4] = (lws *)context;
      *(uchar *)((long)pplVar26 + 0x92) = (uchar)uVar27;
      *pplVar26 = __s;
      memset(__s,0,0x498);
      pplVar26[0xe] = (lws *)((long)&plVar13->lcg[1].owner.head + (ulong)uVar8);
      plVar13 = (lws_context *)
                (__s[1].http.multipart_boundary + ((ulong)plVar23->ops->evlib_size_pt - 0x70));
      ((lws_pt_role_http *)(pplVar26 + 10))->ah_list = (allocated_headers *)0x0;
      *(uint32_t *)((long)pplVar26 + 100) = 0;
      uVar27 = uVar27 + 1;
      pplVar26 = pplVar26 + 0x34;
    } while (uVar27 < context->count_threads);
    iVar7 = (uint)context->count_threads << 3;
  }
  if ((info->ka_interval == 0) && (0 < info->ka_time)) {
    _lws_log_cx(context->log_cx,lws_log_prepend_context,context,1,"lws_create_context",
                "info->ka_interval can\'t be 0 if ka_time used");
  }
  else {
    uVar27 = (ulong)(iVar7 * context->fd_limit_per_thread);
    ppVar14 = (pollfd *)lws_zalloc(uVar27,"fds table");
    context->pt[0].fds = ppVar14;
    if (ppVar14 != (pollfd *)0x0) {
      _lws_log_cx(context->log_cx,lws_log_prepend_context,context,8,"lws_create_context",
                  "ctx: %5luB (%ld ctx + pt(%ld thr x %d)), pt-fds: %d, fdmap: %d",
                  (ulong)(context->pt_serv_buf_size * (uint)context->count_threads) + 2000,2000,
                  (ulong)context->count_threads,(ulong)context->pt_serv_buf_size,
                  (ulong)context->fd_limit_per_thread,uVar27);
      _lws_log_cx(context->log_cx,lws_log_prepend_context,context,8,"lws_create_context",
                  " http: ah_data: %u, ah: %lu, max count %u",(ulong)context->max_http_header_data,
                  0x3d8,(ulong)context->max_http_header_pool);
      pcVar22 = info->server_string;
      if (pcVar22 != (char *)0x0) {
        context->server_string = pcVar22;
        sVar15 = strlen(pcVar22);
        context->server_string_len = (short)sVar15;
      }
      iVar7 = lws_plat_init(context,info);
      if (iVar7 == 0) {
        plVar16 = context->event_loop_ops;
        if (plVar16->init_context != (_func_int_lws_context_ptr_lws_context_creation_info_ptr *)0x0)
        {
          iVar7 = (*plVar16->init_context)(context,info);
          if (iVar7 != 0) goto LAB_0010ac7f;
          plVar16 = context->event_loop_ops;
        }
        if ((plVar16->init_pt != (_func_int_lws_context_ptr_void_ptr_int *)0x0) &&
           (context->count_threads != 0)) {
          uVar27 = 0;
          do {
            if (info->foreign_loops == (void **)0x0) {
              pvVar25 = (void *)0x0;
            }
            else {
              pvVar25 = info->foreign_loops[uVar27];
            }
            iVar7 = (*context->event_loop_ops->init_pt)(context,pvVar25,(int)uVar27);
            if (iVar7 != 0) goto LAB_0010ac7f;
            uVar27 = uVar27 + 1;
          } while (uVar27 < context->count_threads);
        }
        iVar7 = __lws_create_event_pipes(context);
        if (iVar7 == 0) {
          uVar6 = context->count_threads;
          if (uVar6 != 0) {
            uVar27 = 0;
            do {
              plVar11 = available_roles[0];
              pplVar28 = available_roles;
              if (available_roles[0] != (lws_role_ops *)0x0) {
                do {
                  if ((plVar11->rops_idx[0] & 0xf) != 0) {
                    (*plVar11->rops_table[(plVar11->rops_idx[0] & 0xf) - 1].check_upgrades)
                              ((lws *)context);
                  }
                  plVar11 = pplVar28[1];
                  pplVar28 = pplVar28 + 1;
                } while (plVar11 != (lws_role_ops *)0x0);
                uVar6 = context->count_threads;
              }
              uVar27 = uVar27 + 1;
            } while (uVar27 < uVar6);
          }
          lws_context_init_ssl_library(context,info);
          context->user_space = info->user;
          builtin_strncpy(context->canonical_hostname,"unknown",8);
          lws_server_get_canonical_hostname(context,info);
          (context->mgr_system).state_names = system_state_names;
          (context->mgr_system).name = "system";
          (context->mgr_system).state = 1;
          (context->mgr_system).parent = context;
          (context->mgr_system).context = context;
          (context->mgr_system).smd_class = 2;
          (context->protocols_notify).name = "prot_init";
          (context->protocols_notify).notify_cb = lws_state_notify_protocol_init;
          lws_state_reg_notifier(&context->mgr_system,&context->protocols_notify);
          lws_state_reg_notifier_list(&context->mgr_system,info->register_notifier_list);
          if (((info->options & 0x2000) == 0) &&
             (plVar17 = lws_create_vhost(context,info), plVar17 == (lws_vhost *)0x0)) {
            _lws_log_cx(context->log_cx,lws_log_prepend_context,context,1,"lws_create_context",
                        "Failed to create default vhost");
          }
          else {
            if (info->http_nsc_filepath != (char *)0x0) {
              rl.rlim_max = (rlim_t)anon_var_dwarf_880a;
              rl.rlim_cur = (rlim_t)context;
              plVar18 = lws_cache_create((lws_cache_creation_info *)&rl);
              context->nsc = plVar18;
              if (plVar18 == (lws_cache_ttl_lru *)0x0) goto LAB_0010ac7f;
              rl.rlim_max = (rlim_t)anon_var_dwarf_8815;
              plVar18 = lws_cache_create((lws_cache_creation_info *)&rl);
              context->l1 = plVar18;
              if (plVar18 == (lws_cache_ttl_lru *)0x0) {
                _lws_log(1,"Failed to init cookiejar");
                goto LAB_0010ac7f;
              }
            }
            _lws_log_cx(context->log_cx,lws_log_prepend_context,context,8,"lws_create_context",
                        " mem: per-conn:        %5lu bytes + protocol rx buf",0x498);
            if (((info->options & 0x2000) != 0) ||
               (iVar7 = lws_plat_drop_app_privileges(context,1), iVar7 == 0)) {
              lws_sul_schedule(context,0,&context->sul_system_state,
                               lws_context_creation_completion_cb,1);
              lws_cancel_service(context);
              return context;
            }
          }
        }
      }
LAB_0010ac7f:
      lws_context_destroy(context);
      return (lws_context *)0x0;
    }
    _lws_log_cx(context->log_cx,lws_log_prepend_context,context,1,"lws_create_context",
                "OOM allocating %d fds\n",(ulong)context->max_fds);
  }
  _lws_smd_destroy(context);
LAB_0010a69d:
  lwsl_refcount_cx(context->log_cx,-1);
  lws_realloc(context,0,"lws_free");
  return (lws_context *)0x0;
}

Assistant:

struct lws_context *
lws_create_context(const struct lws_context_creation_info *info)
{
	struct lws_context *context = NULL;
#if !defined(LWS_WITH_NO_LOGS)
	const char *s = "IPv6-absent";
#endif
#if defined(LWS_WITH_FILE_OPS)
	struct lws_plat_file_ops *prev;
#endif
#ifndef LWS_NO_DAEMONIZE
	pid_t pid_daemon = get_daemonize_pid();
#endif
#if defined(LWS_WITH_NETWORK)
	const lws_plugin_evlib_t *plev = NULL;
	unsigned short count_threads = 1;
	uint8_t *u;
	uint16_t us_wait_resolution = 0;
#if defined(LWS_WITH_CACHE_NSCOOKIEJAR) && defined(LWS_WITH_CLIENT)
	struct lws_cache_creation_info ci;
#endif

#if defined(__ANDROID__)
	struct rlimit rt;
#endif
	size_t
#if defined(LWS_PLAT_FREERTOS)
		/* smaller default, can set in info->pt_serv_buf_size */
		s1 = 2048,
#else
		s1 = 4096,
#endif
		size = sizeof(struct lws_context);
#endif

	int n;
	unsigned int lpf = info->fd_limit_per_thread;
#if defined(LWS_WITH_EVLIB_PLUGINS) && defined(LWS_WITH_EVENT_LIBS)
	struct lws_plugin		*evlib_plugin_list = NULL;
#if defined(_DEBUG) && !defined(LWS_WITH_NO_LOGS)
	char		*ld_env;
#endif
#endif
#if defined(LWS_WITH_LIBUV)
	char fatal_exit_defer = 0;
#endif


	if (lws_fi(&info->fic, "ctx_createfail1"))
		goto early_bail;

	if (lpf) {
		lpf+= 2;
#if defined(LWS_WITH_SYS_ASYNC_DNS)
		lpf++;
#endif
#if defined(LWS_WITH_SYS_NTPCLIENT)
		lpf++;
#endif
#if defined(LWS_WITH_SYS_DHCP_CLIENT)
		lpf++;
#endif
	}

#if defined(LWS_WITH_IPV6) && !defined(LWS_WITH_NO_LOGS)
	if (!lws_check_opt(info->options, LWS_SERVER_OPTION_DISABLE_IPV6))
		s = "IPV6-on";
	else
		s = "IPV6-off";
#endif

	if (lws_plat_context_early_init())
		goto early_bail;

#if defined(LWS_WITH_NETWORK)
	if (info->count_threads)
		count_threads = (unsigned short)info->count_threads;

	if (count_threads > LWS_MAX_SMP)
		count_threads = LWS_MAX_SMP;

	if (info->pt_serv_buf_size)
		s1 = info->pt_serv_buf_size;

	/* pt fakewsi and the pt serv buf allocations ride after the context */
	size += count_threads * s1;
#if !defined(LWS_PLAT_FREERTOS)
	size += (count_threads * sizeof(struct lws));
#endif

	if (info->event_lib_custom) {
		plev = info->event_lib_custom;
		us_wait_resolution = 0;
	}
#if defined(LWS_WITH_POLL)
	else {
		extern const lws_plugin_evlib_t evlib_poll;
		plev = &evlib_poll;
#if !defined(LWS_PLAT_FREERTOS)
		/*
		 * ... freertos has us-resolution select()...
		 * others are to ms-resolution poll()
		 */
		us_wait_resolution = 1000;
#endif
	}
#endif

#if defined(LWS_WITH_EVLIB_PLUGINS) && defined(LWS_WITH_EVENT_LIBS)

	/*
	 * New style dynamically loaded event lib support
	 *
	 * We have to pick and load the event lib plugin before we allocate
	 * the context object, so we can overallocate it correctly
	 */

#if defined(_DEBUG) && !defined(LWS_WITH_NO_LOGS)
	ld_env = getenv("LD_LIBRARY_PATH");
	lwsl_info("%s: ev lib path %s, '%s'\n", __func__,
			LWS_INSTALL_LIBDIR, ld_env);
#endif

	for (n = 0; n < (int)LWS_ARRAY_SIZE(map); n++) {
		char ok = 0;

		if (!lws_check_opt(info->options, map[n].flag))
			continue;

		if (!lws_plugins_init(&evlib_plugin_list,
				     dlist, "lws_evlib_plugin",
				     map[n].name, NULL, NULL))
			ok = 1;

		if (!ok || lws_fi(&info->fic, "ctx_createfail_plugin_init")) {
			lwsl_err("%s: failed to load %s\n", __func__,
					map[n].name);
			goto bail;
		}

#if defined(LWS_WITH_LIBUV)
		if (!n) /* libuv */
			fatal_exit_defer = !!info->foreign_loops;
#endif

		if (!evlib_plugin_list ||
		    lws_fi(&info->fic, "ctx_createfail_evlib_plugin")) {
			lwsl_err("%s: unable to load evlib plugin %s\n",
					__func__, map[n].name);

			goto bail;
		}
		plev = (const lws_plugin_evlib_t *)evlib_plugin_list->hdr;
		break;
	}
#else
#if defined(LWS_WITH_EVENT_LIBS)
	/*
	 * set the context event loops ops struct
	 *
	 * after this, all event_loop actions use the generic ops
	 */

	/*
	 * oldstyle built-in event lib support
	 *
	 * We have composed them into the libwebsockets lib itself, we can
	 * just pick the ops we want and done
	 */

#if defined(LWS_WITH_LIBUV)
	if (lws_check_opt(info->options, LWS_SERVER_OPTION_LIBUV)) {
		extern const lws_plugin_evlib_t evlib_uv;
		plev = &evlib_uv;
		fatal_exit_defer = !!info->foreign_loops;
		us_wait_resolution = 0;
	}
#endif

#if defined(LWS_WITH_LIBEVENT)
	if (lws_check_opt(info->options, LWS_SERVER_OPTION_LIBEVENT)) {
		extern const lws_plugin_evlib_t evlib_event;
		plev = &evlib_event;
		us_wait_resolution = 0;
	}
#endif

#if defined(LWS_WITH_GLIB)
	if (lws_check_opt(info->options, LWS_SERVER_OPTION_GLIB)) {
		extern const lws_plugin_evlib_t evlib_glib;
		plev = &evlib_glib;
		us_wait_resolution = 0;
	}
#endif

#if defined(LWS_WITH_LIBEV)
	if (lws_check_opt(info->options, LWS_SERVER_OPTION_LIBEV)) {
		extern const lws_plugin_evlib_t evlib_ev;
		plev = &evlib_ev;
		us_wait_resolution = 0;
	}
#endif

#if defined(LWS_WITH_SDEVENT)
    if (lws_check_opt(info->options, LWS_SERVER_OPTION_SDEVENT)) {
        extern const lws_plugin_evlib_t evlib_sd;
        plev = &evlib_sd;
        us_wait_resolution = 0;
    }
#endif

#if defined(LWS_WITH_ULOOP)
    if (lws_check_opt(info->options, LWS_SERVER_OPTION_ULOOP)) {
        extern const lws_plugin_evlib_t evlib_uloop;
        plev = &evlib_uloop;
        us_wait_resolution = 0;
    }
#endif

#endif /* with event libs */

#endif /* not with ev plugins */

	if (!plev || lws_fi(&info->fic, "ctx_createfail_evlib_sel"))
		goto fail_event_libs;

#if defined(LWS_WITH_NETWORK)
	size += (size_t)plev->ops->evlib_size_ctx /* the ctx evlib priv */ +
		(count_threads * (size_t)plev->ops->evlib_size_pt) /* the pt evlib priv */;
#endif

	context = lws_zalloc(size, "context");
	if (!context || lws_fi(&info->fic, "ctx_createfail_oom_ctx")) {
#if defined(LWS_WITH_SYS_FAULT_INJECTION)
		lws_free(context);
#endif
		lwsl_err("OOM");
		goto early_bail;
	}

#if defined(LWS_WITH_NETWORK)
	context->event_loop_ops = plev->ops;
	context->us_wait_resolution = us_wait_resolution;
#if defined(LWS_WITH_TLS_JIT_TRUST)
	{
		struct lws_cache_creation_info ci;

		memset(&ci, 0, sizeof(ci));
		ci.cx = context;
		ci.ops = &lws_cache_ops_heap;
		ci.name = "jitt";
		ci.max_footprint = info->jitt_cache_max_footprint;
		context->trust_cache = lws_cache_create(&ci);
	}
#endif
#endif
#if defined(LWS_WITH_EVENT_LIBS)
	/* at the very end */
	context->evlib_ctx = (uint8_t *)context + size -
					plev->ops->evlib_size_ctx;
#endif
#if defined(LWS_WITH_EVLIB_PLUGINS) && defined(LWS_WITH_EVENT_LIBS)
	context->evlib_plugin_list = evlib_plugin_list;
#endif

#if !defined(LWS_PLAT_FREERTOS)
	context->uid = info->uid;
	context->gid = info->gid;
	context->username = info->username;
	context->groupname = info->groupname;
#endif
	context->name			= info->vhost_name;
	if (info->log_cx)
		context->log_cx = info->log_cx;
	else
		context->log_cx = &log_cx;
	lwsl_refcount_cx(context->log_cx, 1);

	context->system_ops = info->system_ops;
	context->pt_serv_buf_size = (unsigned int)s1;
	context->protocols_copy = info->protocols;
#if defined(LWS_WITH_TLS_JIT_TRUST)
	context->vh_idle_grace_ms = info->vh_idle_grace_ms ?
			info->vh_idle_grace_ms : 5000;
#endif

#if defined(LWS_WITH_SYS_FAULT_INJECTION)
	context->fic.name = "ctx";
	if (info->fic.fi_owner.count)
		/*
		 * This moves all the lws_fi_t from info->fi to the context fi,
		 * leaving it empty, so no injection added to default vhost
		 */
		lws_fi_import(&context->fic, &info->fic);
#endif


#if defined(LWS_WITH_SYS_SMD)
	context->smd_ttl_us = info->smd_ttl_us ? info->smd_ttl_us :
#if defined(LWS_PLAT_FREERTOS)
			5000000;
#else
			2000000;
#endif
	context->smd_queue_depth = (uint16_t)(info->smd_queue_depth ?
						info->smd_queue_depth :
#if defined(LWS_PLAT_FREERTOS)
						20);
#else
						40);
#endif
#endif

#if defined(LWS_WITH_NETWORK)
	context->lcg[LWSLCG_WSI].tag_prefix = "wsi";
	context->lcg[LWSLCG_VHOST].tag_prefix = "vh";
	context->lcg[LWSLCG_WSI_SERVER].tag_prefix = "wsisrv"; /* adopted */

#if defined(LWS_ROLE_H2) || defined(LWS_ROLE_MQTT)
	context->lcg[LWSLCG_WSI_MUX].tag_prefix = "mux", /* a mux child wsi */
#endif

#if defined(LWS_WITH_CLIENT)
	context->lcg[LWSLCG_WSI_CLIENT].tag_prefix = "wsicli";
#endif

#if defined(LWS_WITH_SECURE_STREAMS)
#if defined(LWS_WITH_CLIENT)
	context->lcg[LWSLCG_SS_CLIENT].tag_prefix = "SScli";
#endif
#if defined(LWS_WITH_SERVER)
	context->lcg[LWSLCG_SS_SERVER].tag_prefix = "SSsrv";
#endif
#if defined(LWS_WITH_CLIENT)
	context->lcg[LWSLCG_WSI_SS_CLIENT].tag_prefix = "wsiSScli";
#endif
#if defined(LWS_WITH_SERVER)
	context->lcg[LWSLCG_WSI_SS_SERVER].tag_prefix = "wsiSSsrv";
#endif
#endif
#endif

#if defined(LWS_WITH_SYS_METRICS)
	/*
	 * If we're not using secure streams, we can still pass in a linked-
	 * list of metrics policies
	 */
	context->metrics_policies = info->metrics_policies;
	context->metrics_prefix = info->metrics_prefix;

	context->mt_service = lws_metric_create(context,
					LWSMTFL_REPORT_DUTY_WALLCLOCK_US |
					LWSMTFL_REPORT_ONLY_GO, "cpu.svc");

#if defined(LWS_WITH_CLIENT)

	context->mt_conn_dns = lws_metric_create(context,
						 LWSMTFL_REPORT_MEAN |
						 LWSMTFL_REPORT_DUTY_WALLCLOCK_US,
						 "n.cn.dns");
	context->mt_conn_tcp = lws_metric_create(context,
						 LWSMTFL_REPORT_MEAN |
						 LWSMTFL_REPORT_DUTY_WALLCLOCK_US,
						 "n.cn.tcp");
	context->mt_conn_tls = lws_metric_create(context,
						 LWSMTFL_REPORT_MEAN |
						 LWSMTFL_REPORT_DUTY_WALLCLOCK_US,
						 "n.cn.tls");
#if defined(LWS_ROLE_H1) || defined(LWS_ROLE_H2)
	context->mt_http_txn = lws_metric_create(context,
						 LWSMTFL_REPORT_MEAN |
						 LWSMTFL_REPORT_DUTY_WALLCLOCK_US,
						 "n.http.txn");
#endif

	context->mth_conn_failures = lws_metric_create(context,
					LWSMTFL_REPORT_HIST, "n.cn.failures");

#if defined(LWS_WITH_SYS_ASYNC_DNS)
	context->mt_adns_cache = lws_metric_create(context,
						   LWSMTFL_REPORT_MEAN |
						   LWSMTFL_REPORT_DUTY_WALLCLOCK_US,
						   "n.cn.adns");
#endif
#if defined(LWS_WITH_SECURE_STREAMS)
	context->mth_ss_conn = lws_metric_create(context, LWSMTFL_REPORT_HIST,
						 "n.ss.conn");
#endif
#if defined(LWS_WITH_SECURE_STREAMS_PROXY_API)
	context->mt_ss_cliprox_conn = lws_metric_create(context,
			LWSMTFL_REPORT_HIST,
							"n.ss.cliprox.conn");
	context->mt_ss_cliprox_paylat = lws_metric_create(context,
							  LWSMTFL_REPORT_MEAN |
							  LWSMTFL_REPORT_DUTY_WALLCLOCK_US,
							  "n.ss.cliprox.paylat");
	context->mt_ss_proxcli_paylat = lws_metric_create(context,
							  LWSMTFL_REPORT_MEAN |
							  LWSMTFL_REPORT_DUTY_WALLCLOCK_US,
							  "n.ss.proxcli.paylat");
#endif

#endif /* network + metrics + client */

#if defined(LWS_WITH_SERVER)
	context->mth_srv = lws_metric_create(context,
					     LWSMTFL_REPORT_HIST, "n.srv");
#endif /* network + metrics + server */

#endif /* network + metrics */

#endif /* network */

	lwsl_cx_notice(context, "LWS: %s, %s%s", library_version, opts_str, s);
#if defined(LWS_WITH_NETWORK)
	lwsl_cx_info(context, "Event loop: %s", plev->ops->name);
#endif

	/*
	 * Proxy group
	 */

#if defined(LWS_WITH_SECURE_STREAMS_PROXY_API)
#if defined(LWS_WITH_CLIENT)
	context->lcg[LWSLCG_SSP_CLIENT].tag_prefix = "SSPcli";
#endif
#if defined(LWS_WITH_SERVER)
	context->lcg[LWSLCG_SSP_ONWARD].tag_prefix = "SSPonw";
#endif
#if defined(LWS_WITH_CLIENT)
	context->lcg[LWSLCG_WSI_SSP_CLIENT].tag_prefix = "wsiSSPcli";
#endif
#if defined(LWS_WITH_SERVER)
	context->lcg[LWSLCG_WSI_SSP_ONWARD].tag_prefix = "wsiSSPonw";
#endif
#endif


#if defined(LWS_WITH_SECURE_STREAMS_STATIC_POLICY_ONLY)
	/* directly use the user-provided policy object list */
	context->pss_policies = info->pss_policies;
#endif

#if defined(LWS_WITH_SECURE_STREAMS_PROXY_API) && defined(LWS_WITH_CLIENT)
	context->ss_proxy_bind = info->ss_proxy_bind;
	context->ss_proxy_port = info->ss_proxy_port;
	context->ss_proxy_address = info->ss_proxy_address;
	if (context->ss_proxy_bind && context->ss_proxy_address)
		lwsl_cx_notice(context, "ss proxy bind '%s', port %d, ads '%s'",
			context->ss_proxy_bind, context->ss_proxy_port,
			context->ss_proxy_address);
#endif

#if defined(LWS_WITH_NETWORK)
	context->undestroyed_threads = count_threads;
	context->count_threads = count_threads;

#if defined(LWS_ROLE_WS) && defined(LWS_WITHOUT_EXTENSIONS)
        if (info->extensions)
                lwsl_cx_warn(context, "WITHOUT_EXTENSIONS but exts ptr set");
#endif
#endif /* network */

#if defined(LWS_WITH_SECURE_STREAMS)
#if !defined(LWS_WITH_SECURE_STREAMS_STATIC_POLICY_ONLY)
	context->pss_policies_json = info->pss_policies_json;
#endif
#if defined(LWS_WITH_SSPLUGINS)
	context->pss_plugins = info->pss_plugins;
#endif
#endif

	/* if he gave us names, set the uid / gid */
	if (lws_plat_drop_app_privileges(context, 0) ||
	    lws_fi(&context->fic, "ctx_createfail_privdrop"))
		goto free_context_fail2;

#if defined(LWS_WITH_TLS) && defined(LWS_WITH_NETWORK)
#if defined(LWS_WITH_MBEDTLS)
	context->tls_ops = &tls_ops_mbedtls;

	mbedtls_client_preload_filepath = info->mbedtls_client_preload_filepath;
#else
	context->tls_ops = &tls_ops_openssl;
#endif
#endif

#if LWS_MAX_SMP > 1
	lws_mutex_refcount_init(&context->mr);
#endif

#if defined(LWS_PLAT_FREERTOS)
#if defined(LWS_AMAZON_RTOS)
	context->last_free_heap = xPortGetFreeHeapSize();
#else
	context->last_free_heap = esp_get_free_heap_size();
#endif
#endif

#if defined(LWS_WITH_FILE_OPS)
	/* default to just the platform fops implementation */

	context->fops_platform.LWS_FOP_OPEN	= _lws_plat_file_open;
	context->fops_platform.LWS_FOP_CLOSE	= _lws_plat_file_close;
	context->fops_platform.LWS_FOP_SEEK_CUR	= _lws_plat_file_seek_cur;
	context->fops_platform.LWS_FOP_READ	= _lws_plat_file_read;
	context->fops_platform.LWS_FOP_WRITE	= _lws_plat_file_write;
	context->fops_platform.fi[0].sig	= NULL;

	/*
	 *  arrange a linear linked-list of fops starting from context->fops
	 *
	 * platform fops
	 * [ -> fops_zip (copied into context so .next settable) ]
	 * [ -> info->fops ]
	 */

	context->fops = &context->fops_platform;
	prev = (struct lws_plat_file_ops *)context->fops;

#if defined(LWS_WITH_ZIP_FOPS)
	/* make a soft copy so we can set .next */
	context->fops_zip = fops_zip;
	prev->next = &context->fops_zip;
	prev = (struct lws_plat_file_ops *)prev->next;
#endif

	/* if user provided fops, tack them on the end of the list */
	if (info->fops)
		prev->next = info->fops;
#endif

#if defined(LWS_WITH_SERVER)
	context->reject_service_keywords = info->reject_service_keywords;
#endif
	if (info->external_baggage_free_on_destroy)
		context->external_baggage_free_on_destroy =
			info->external_baggage_free_on_destroy;
#if defined(LWS_WITH_NETWORK)
	context->time_up = lws_now_usecs();
#endif
	context->pcontext_finalize = info->pcontext;

#if defined(LWS_WITH_TLS) && defined(LWS_WITH_NETWORK)
	context->simultaneous_ssl_restriction =
			info->simultaneous_ssl_restriction;
	context->ssl_handshake_serialize = info->ssl_handshake_serialize;
#endif

	context->options = info->options;

#if !defined(LWS_PLAT_FREERTOS) && !defined(LWS_PLAT_OPTEE) && !defined(WIN32)
	/*
	 * If asked, try to set the rlimit / ulimit for process sockets / files.
	 * We read the effective limit in a moment, so we will find out the
	 * real limit according to system constraints then.
	 */
	if (info->rlimit_nofile) {
		struct rlimit rl;

		rl.rlim_cur = (unsigned int)info->rlimit_nofile;
		rl.rlim_max = (unsigned int)info->rlimit_nofile;
		setrlimit(RLIMIT_NOFILE, &rl);
	}
#endif

#ifndef LWS_NO_DAEMONIZE
	if (pid_daemon) {
		context->started_with_parent = pid_daemon;
		lwsl_cx_info(context, " Started with daemon pid %u",
				(unsigned int)pid_daemon);
	}
#endif
#if defined(__ANDROID__)
	n = getrlimit(RLIMIT_NOFILE, &rt);
	if (n == -1) {
		lwsl_cx_err(context, "Get RLIMIT_NOFILE failed!");

		goto free_context_fail2;
	}
	context->max_fds = (unsigned int)rt.rlim_cur;
#else
#if defined(WIN32) || defined(_WIN32) || defined(LWS_AMAZON_RTOS) || defined(LWS_ESP_PLATFORM)
	context->max_fds = getdtablesize();
#else
	{
		long l = sysconf(_SC_OPEN_MAX);

		context->max_fds = 2560;

		if (l > 10000000)
			lwsl_cx_warn(context, "unreasonable ulimit -n workaround");
		else
			if (l != -1l)
				context->max_fds = (unsigned int)l;
	}
#endif
	if ((int)context->max_fds < 0 ||
	     lws_fi(&context->fic, "ctx_createfail_maxfds")) {
		lwsl_cx_err(context, "problem getting process max files");

		goto free_context_fail2;
	}
#endif

	/*
	 * deal with any max_fds override, if it's reducing (setting it to
	 * more than ulimit -n is meaningless).  The platform init will
	 * figure out what if this is something it can deal with.
	 */
	if (info->fd_limit_per_thread) {
		unsigned int mf = lpf * context->count_threads;

		if (mf < context->max_fds) {
			context->max_fds_unrelated_to_ulimit = 1;
			context->max_fds = mf;
		}
	}

#if defined(LWS_WITH_NETWORK)
	context->token_limits = info->token_limits;
#endif


#if defined(LWS_WITH_TLS) && defined(LWS_WITH_NETWORK)
	time(&context->tls.last_cert_check_s);
	if (info->alpn)
		context->tls.alpn_default = info->alpn;
	else {
		char *p = context->tls.alpn_discovered, first = 1;

		LWS_FOR_EVERY_AVAILABLE_ROLE_START(ar) {
			if (ar->alpn) {
				if (!first)
					*p++ = ',';
				p += lws_snprintf(p, (unsigned int)(
					(context->tls.alpn_discovered +
					sizeof(context->tls.alpn_discovered) -
					2) - p), "%s", ar->alpn);
				first = 0;
			}
		} LWS_FOR_EVERY_AVAILABLE_ROLE_END;

		context->tls.alpn_default = context->tls.alpn_discovered;
	}

#endif
#if defined(LWS_WITH_NETWORK)
	if (info->timeout_secs)
		context->timeout_secs = info->timeout_secs;
	else
#endif
		context->timeout_secs = 15;

#if defined(LWS_ROLE_H1) || defined(LWS_ROLE_H2)
	if (info->max_http_header_data)
		context->max_http_header_data = info->max_http_header_data;
	else
		if (info->max_http_header_data2)
			context->max_http_header_data =
					(unsigned short)info->max_http_header_data2;
		else
			context->max_http_header_data = LWS_DEF_HEADER_LEN;

	if (info->max_http_header_pool)
		context->max_http_header_pool = info->max_http_header_pool;
	else
		if (info->max_http_header_pool2)
			context->max_http_header_pool =
					(unsigned short)info->max_http_header_pool2;
		else
			context->max_http_header_pool = context->max_fds;
#endif

	if (info->fd_limit_per_thread)
		context->fd_limit_per_thread = lpf;
	else
		if (context->count_threads)
			context->fd_limit_per_thread = context->max_fds /
							context->count_threads;

#if defined(LWS_WITH_SYS_SMD)
	lws_mutex_init(context->smd.lock_messages);
	lws_mutex_init(context->smd.lock_peers);

	/* lws_system smd participant */

	if (!lws_smd_register(context, context, 0, LWSSMDCL_NETWORK,
			      lws_system_smd_cb)) {
		lwsl_cx_err(context, "early smd register failed");
	}

	/* user smd participant */

	if (info->early_smd_cb &&
	    !lws_smd_register(context, info->early_smd_opaque, 0,
			      info->early_smd_class_filter,
			      info->early_smd_cb)) {
		lwsl_cx_err(context, "early smd register failed");
	}
#endif

	n = 0;
#if defined(LWS_WITH_NETWORK)

	context->default_retry.retry_ms_table = default_backoff_table;
	context->default_retry.conceal_count =
			context->default_retry.retry_ms_table_count =
					LWS_ARRAY_SIZE(default_backoff_table);
	context->default_retry.jitter_percent = 20;
	context->default_retry.secs_since_valid_ping = 300;
	context->default_retry.secs_since_valid_hangup = 310;

	if (info->retry_and_idle_policy &&
	    info->retry_and_idle_policy->secs_since_valid_ping) {
		context->default_retry.secs_since_valid_ping =
				info->retry_and_idle_policy->secs_since_valid_ping;
		context->default_retry.secs_since_valid_hangup =
				info->retry_and_idle_policy->secs_since_valid_hangup;
	}

	/*
	 * Allocate the per-thread storage for scratchpad buffers,
	 * and header data pool
	 */
	u = (uint8_t *)&context[1];
	for (n = 0; n < context->count_threads; n++) {
		context->pt[n].serv_buf = u;
		u += context->pt_serv_buf_size;

		context->pt[n].context = context;
		context->pt[n].tid = (uint8_t)n;

#if !defined(LWS_PLAT_FREERTOS)
		/*
		 * We overallocated for a fakewsi (can't compose it in the
		 * pt because size isn't known at that time).  point to it
		 * and zero it down.  Fakewsis are needed to make callbacks work
		 * when the source of the callback is not actually from a wsi
		 * context.
		 */
		context->pt[n].fake_wsi = (struct lws *)u;
		u += sizeof(struct lws);

		memset(context->pt[n].fake_wsi, 0, sizeof(struct lws));
#endif

		context->pt[n].evlib_pt = u;
		u += plev->ops->evlib_size_pt;

#if defined(LWS_ROLE_H1) || defined(LWS_ROLE_H2)
		context->pt[n].http.ah_list = NULL;
		context->pt[n].http.ah_pool_length = 0;
#endif
		lws_pt_mutex_init(&context->pt[n]);
#if defined(LWS_WITH_SEQUENCER)
		lws_seq_pt_init(&context->pt[n]);
#endif

#if defined(LWS_WITH_CGI)
		if (lws_rops_fidx(&role_ops_cgi, LWS_ROPS_pt_init_destroy))
			(lws_rops_func_fidx(&role_ops_cgi, LWS_ROPS_pt_init_destroy)).
				pt_init_destroy(context, info,
						&context->pt[n], 0);
#endif
	}

	if (!info->ka_interval && info->ka_time > 0) {
		lwsl_cx_err(context, "info->ka_interval can't be 0 if ka_time used");
		goto free_context_fail;
	}

#if defined(LWS_WITH_PEER_LIMITS)
	/* scale the peer hash table according to the max fds for the process,
	 * so that the max list depth averages 16.  Eg, 1024 fd -> 64,
	 * 102400 fd -> 6400
	 */

	context->pl_hash_elements =
		(context->count_threads * context->fd_limit_per_thread) / 16;
	context->pl_hash_table = lws_zalloc(sizeof(struct lws_peer *) *
			context->pl_hash_elements, "peer limits hash table");

	context->ip_limit_ah = info->ip_limit_ah;
	context->ip_limit_wsi = info->ip_limit_wsi;
	context->pl_notify_cb = info->pl_notify_cb;
#endif

	/*
	 * fds table contains pollfd structs for as many pollfds as we can
	 * handle... spread across as many service threads as we have going
	 */
	n = (int)(sizeof(struct lws_pollfd) * context->count_threads *
	    context->fd_limit_per_thread);
	context->pt[0].fds = lws_zalloc((unsigned int)n, "fds table");
	if (context->pt[0].fds == NULL ||
	    lws_fi(&context->fic, "ctx_createfail_oom_fds")) {
#if defined(LWS_WITH_SYS_FAULT_INJECTION)
		lws_free(context->pt[0].fds);
#endif
		lwsl_cx_err(context, "OOM allocating %d fds\n", context->max_fds);
		goto free_context_fail;
	}
#endif

	lwsl_cx_info(context, "ctx: %5luB (%ld ctx + pt(%ld thr x %d)), "
		  "pt-fds: %d, fdmap: %d",
		  (long)sizeof(struct lws_context) +
		  (context->count_threads * context->pt_serv_buf_size),
		  (long)sizeof(struct lws_context),
		  (long)context->count_threads,
		  context->pt_serv_buf_size,
		  context->fd_limit_per_thread, n);

#if defined(LWS_ROLE_H1) || defined(LWS_ROLE_H2)
	lwsl_cx_info(context, " http: ah_data: %u, ah: %lu, max count %u",
		    context->max_http_header_data,
		    (long)sizeof(struct allocated_headers),
		    context->max_http_header_pool);
#endif

#if defined(LWS_WITH_SERVER)
	if (info->server_string) {
		context->server_string = info->server_string;
		context->server_string_len = (short)
				strlen(context->server_string);
	}
#endif

#if LWS_MAX_SMP > 1
	/* each thread serves his own chunk of fds */
	for (n = 1; n < (int)context->count_threads; n++)
		context->pt[n].fds = context->pt[n - 1].fds +
				     context->fd_limit_per_thread;
#endif


	/*
	 * Past here, we may have added handles to the event lib
	 * loop and if libuv,  have to take care about how to unpick them...
	 */

	if (lws_plat_init(context, info) ||
	    lws_fi(&context->fic, "ctx_createfail_plat_init"))
		goto bail_libuv_aware;

#if defined(LWS_WITH_NETWORK)

	if (lws_fi(&context->fic, "ctx_createfail_evlib_init"))
		goto bail_libuv_aware;

	if (context->event_loop_ops->init_context)
		if (context->event_loop_ops->init_context(context, info))
			goto bail_libuv_aware;

	if (lws_fi(&context->fic, "ctx_createfail_evlib_pt"))
		goto bail_libuv_aware;

	if (context->event_loop_ops->init_pt)
		for (n = 0; n < context->count_threads; n++) {
			void *lp = NULL;

			if (info->foreign_loops)
				lp = info->foreign_loops[n];

			if (context->event_loop_ops->init_pt(context, lp, n))
				goto bail_libuv_aware;
		}

	lws_context_lock(context, __func__);
	n = __lws_create_event_pipes(context);
	lws_context_unlock(context);
	if (n)
		goto bail_libuv_aware;

	for (n = 0; n < context->count_threads; n++) {
		LWS_FOR_EVERY_AVAILABLE_ROLE_START(ar) {
			if (lws_rops_fidx(ar, LWS_ROPS_pt_init_destroy))
				(lws_rops_func_fidx(ar, LWS_ROPS_pt_init_destroy)).
					pt_init_destroy(context, info,
							&context->pt[n], 0);
		} LWS_FOR_EVERY_AVAILABLE_ROLE_END;
	}
#endif

	lws_context_init_ssl_library(context, info);

	context->user_space = info->user;

#if defined(LWS_WITH_SERVER)
	strcpy(context->canonical_hostname, "unknown");
#if defined(LWS_WITH_NETWORK)
	lws_server_get_canonical_hostname(context, info);
#endif
#endif

#if defined(LWS_HAVE_SYS_CAPABILITY_H) && defined(LWS_HAVE_LIBCAP)
	memcpy(context->caps, info->caps, sizeof(context->caps));
	context->count_caps = info->count_caps;
#endif


#if defined(LWS_WITH_NETWORK)

#if defined(LWS_WITH_SYS_ASYNC_DNS) || defined(LWS_WITH_SYS_NTPCLIENT) || \
	defined(LWS_WITH_SYS_DHCP_CLIENT)
	{
		/*
		 * system vhost
		 */

		struct lws_context_creation_info ii;
		const struct lws_protocols *pp[4];
		struct lws_vhost *vh;
#if defined(LWS_WITH_SYS_ASYNC_DNS)
		extern const struct lws_protocols lws_async_dns_protocol;
#endif
#if defined(LWS_WITH_SYS_NTPCLIENT)
		extern const struct lws_protocols lws_system_protocol_ntpc;
#endif
#if defined(LWS_WITH_SYS_DHCP_CLIENT)
		extern const struct lws_protocols lws_system_protocol_dhcpc4;
#endif

		n = 0;
#if defined(LWS_WITH_SYS_ASYNC_DNS)
		pp[n++] = &lws_async_dns_protocol;
#endif
#if defined(LWS_WITH_SYS_NTPCLIENT)
		pp[n++] = &lws_system_protocol_ntpc;
#endif
#if defined(LWS_WITH_SYS_DHCP_CLIENT)
		pp[n++] = &lws_system_protocol_dhcpc4;
#endif
		pp[n] = NULL;

		memset(&ii, 0, sizeof(ii));
		ii.vhost_name = "system";
		ii.pprotocols = pp;
		ii.port = CONTEXT_PORT_NO_LISTEN;

		if (lws_fi(&context->fic, "ctx_createfail_sys_vh"))
			vh = NULL;
		else
			vh = lws_create_vhost(context, &ii);
		if (!vh) {
			lwsl_cx_err(context, "failed to create system vhost");
			goto bail_libuv_aware;
		}

		context->vhost_system = vh;

		if (lws_protocol_init_vhost(vh, NULL) ||
		    lws_fi(&context->fic, "ctx_createfail_sys_vh_init")) {
			lwsl_cx_err(context, "failed to init system vhost");
			goto bail_libuv_aware;
		}
#if defined(LWS_WITH_SYS_ASYNC_DNS)
		lws_async_dns_init(context);
			//goto bail_libuv_aware;
#endif
	}

#endif

#if defined(LWS_WITH_SYS_STATE)
	/*
	 * init the lws_state mgr for the system state
	 */

	context->mgr_system.state_names		= system_state_names;
	context->mgr_system.name		= "system";
	context->mgr_system.state		= LWS_SYSTATE_CONTEXT_CREATED;
	context->mgr_system.parent		= context;
	context->mgr_system.context		= context;
#if defined(LWS_WITH_SYS_SMD)
	context->mgr_system.smd_class		= LWSSMDCL_SYSTEM_STATE;
#endif

	context->protocols_notify.name		= "prot_init";
	context->protocols_notify.notify_cb	= lws_state_notify_protocol_init;

	lws_state_reg_notifier(&context->mgr_system, &context->protocols_notify);

	/*
	 * insert user notifiers here so they can participate with vetoing us
	 * trying to jump straight to operational, or at least observe us
	 * reaching 'operational', before we returned from context creation.
	 */

	lws_state_reg_notifier_list(&context->mgr_system,
				    info->register_notifier_list);
#endif

	/*
	 * if he's not saying he'll make his own vhosts later then act
	 * compatibly and make a default vhost using the data in the info
	 */
	if (!lws_check_opt(info->options, LWS_SERVER_OPTION_EXPLICIT_VHOSTS)) {
		if (!lws_create_vhost(context, info) ||
		    lws_fi(&context->fic, "ctx_createfail_def_vh")) {
			lwsl_cx_err(context, "Failed to create default vhost");

#if defined(LWS_WITH_PEER_LIMITS)
			lws_free_set_NULL(context->pl_hash_table);
#endif
			goto bail;
		}
	}

#if defined(LWS_WITH_CACHE_NSCOOKIEJAR) && defined(LWS_WITH_CLIENT)
	if (info->http_nsc_filepath) {
		memset(&ci, 0, sizeof(ci));

		ci.cx			   = context;
		ci.ops			   = &lws_cache_ops_nscookiejar;
		ci.name			   = "NSC";
		ci.u.nscookiejar.filepath  = info->http_nsc_filepath;

		context->nsc = lws_cache_create(&ci);
		if (!context->nsc)
			goto bail;

		ci.ops			  = &lws_cache_ops_heap;
		ci.name			  = "L1";
		ci.parent		  = context->nsc;
		ci.max_footprint	  = info->http_nsc_heap_max_footprint;
		ci.max_items		  = info->http_nsc_heap_max_items;
		ci.max_payload		  = info->http_nsc_heap_max_payload;

		context->l1 = lws_cache_create(&ci);
		if (!context->l1) {
			lwsl_err("Failed to init cookiejar");
			goto bail;
		}
	}
#endif

#if defined(LWS_WITH_SECURE_STREAMS)

#if !defined(LWS_WITH_SECURE_STREAMS_STATIC_POLICY_ONLY)
	if (context->pss_policies_json) {
		/*
		 * You must create your context with the explicit vhosts flag
		 * in order to use secure streams
		 */
		assert(lws_check_opt(info->options,
		       LWS_SERVER_OPTION_EXPLICIT_VHOSTS));

		if (lws_ss_policy_parse_begin(context, 0) ||
		    lws_fi(&context->fic, "ctx_createfail_ss_pol1")) {
#if defined(LWS_WITH_SYS_FAULT_INJECTION)
			lws_ss_policy_parse_abandon(context);
#endif
			goto bail_libuv_aware;
		}

		n = lws_ss_policy_parse(context,
					(uint8_t *)context->pss_policies_json,
					strlen(context->pss_policies_json));
		if ((n != LEJP_CONTINUE && n < 0) ||
		    lws_fi(&context->fic, "ctx_createfail_ss_pol2")) {
			lws_ss_policy_parse_abandon(context);
			goto bail_libuv_aware;
		}

		if (lws_ss_policy_set(context, "hardcoded") ||
		    lws_fi(&context->fic, "ctx_createfail_ss_pol3")) {
			lwsl_cx_err(context, "policy set failed");
			goto bail_libuv_aware;
		}
	}
#else
	if (context->pss_policies) {
		/* user code set the policy objects directly, no parsing step */

		if (lws_ss_policy_set(context, "hardcoded") ||
		    lws_fi(&context->fic, "ctx_createfail_ss_pol3")) {
			lwsl_cx_err(context, "policy set failed");
			goto bail_libuv_aware;
		}
	}
#endif
#endif

	lws_context_init_extensions(info, context);

	lwsl_cx_info(context, " mem: per-conn:        %5lu bytes + protocol rx buf",
		    (unsigned long)sizeof(struct lws));

	/*
	 * drop any root privs for this process
	 * to listen on port < 1023 we would have needed root, but now we are
	 * listening, we don't want the power for anything else
	 */
	if (!lws_check_opt(info->options, LWS_SERVER_OPTION_EXPLICIT_VHOSTS))
		if (lws_plat_drop_app_privileges(context, 1) ||
		    lws_fi(&context->fic, "ctx_createfail_privdrop"))
			goto bail_libuv_aware;

#if defined(LWS_WITH_SYS_STATE)
	/*
	 * We want to move on the syste, state as far as it can go towards
	 * OPERATIONAL now.  But we have to return from here first so the user
	 * code that called us can set its copy of context, which it may be
	 * relying on to perform operations triggered by the state change.
	 *
	 * We set up a sul to come back immediately and do the state change.
	 */

	lws_sul_schedule(context, 0, &context->sul_system_state,
			 lws_context_creation_completion_cb, 1);
#endif

	/* expedite post-context init (eg, protocols) */
	lws_cancel_service(context);
#endif

	return context;

early_bail:
	lws_fi_destroy(&info->fic);

	return NULL;

#if defined(LWS_WITH_NETWORK)
bail:
	lws_fi_destroy(&info->fic);
	lws_context_destroy(context);

	return NULL;
#endif

bail_libuv_aware:
	lws_context_destroy(context);
#if defined(LWS_WITH_LIBUV)
	return fatal_exit_defer ? context : NULL;
#else
	return NULL;
#endif

#if defined(LWS_WITH_NETWORK)
fail_event_libs:
	if (context)
	lwsl_cx_err(context, "Requested event library support not configured");
#endif

#if defined(LWS_WITH_NETWORK)
free_context_fail:
	if (context) {
#if defined(LWS_WITH_SYS_SMD)
		_lws_smd_destroy(context);
#endif
	}
#endif
free_context_fail2:
	if (context) {
#if defined(LWS_WITH_SYS_METRICS)
		lws_metrics_destroy(context);
#endif
		lws_fi_destroy(&context->fic);
	}
	lws_fi_destroy(&info->fic);
	if (context) {
		lwsl_refcount_cx(context->log_cx, -1);
		lws_free(context);
	}

	return NULL;
}